

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doublingfactorcounter_test.cpp
# Opt level: O2

void __thiscall
TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test::testBody
          (TEST_DoublingFactorCounterTest_HonorTiles_Wind_Test *this)

{
  WiningState *this_00;
  set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_> *this_01;
  size_type sVar1;
  UtestShell *pUVar2;
  size_type sVar3;
  char *pcVar4;
  char *pcVar5;
  int value;
  DoubligFactorCounter *this_02;
  SimpleString local_158;
  TestTerminatorWithoutExceptions local_150;
  key_type local_144;
  DoublingFactorReport local_140;
  DoublingFactorReport r;
  
  this_00 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).s;
  mahjong::WiningState::setRoundWind(this_00,EastWind);
  mahjong::WiningState::setSeatWind(this_00,SouthWind);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addPair
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,WhiteDragon);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,OneOfCharacters,true);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfCircles,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addSequence
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,TwoOfBamboos,false);
  TEST_GROUP_CppUTestGroupDoublingFactorCounterTest::addTriplet
            (&this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest,EastWind,false);
  mahjong::WiningState::selfDrawn(this_00,(SelfDrawnSituation)0x0);
  this_02 = &(this->super_TEST_GROUP_CppUTestGroupDoublingFactorCounterTest).c;
  mahjong::DoubligFactorCounter::report(&r,this_02);
  this_01 = &r.patterns;
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xe;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count(this_01,(key_type *)&local_140);
  if (sVar1 == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_140.wining_hand.pairs.
                           super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0xe);
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_140);
    local_158.buffer_._0_4_ = 0xe;
    sVar3 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_158);
    if (sVar1 != sVar3) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1df);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar4 = SimpleString::asCharString((SimpleString *)&local_140);
    local_144 = EastWind;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count(this_01,&local_144);
    StringFrom((unsigned_long)&local_158);
    pcVar5 = SimpleString::asCharString(&local_158);
    local_150.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1df,&local_150);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_150);
    SimpleString::~SimpleString(&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  value = (int)&local_158;
  if (r.doubling_factor == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar4 = SimpleString::asCharString((SimpleString *)&local_140);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_158);
    local_150.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e0,&local_150);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_150);
    SimpleString::~SimpleString(&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  mahjong::WiningState::setSeatWind(this_00,EastWind);
  mahjong::DoubligFactorCounter::report(&local_140,this_02);
  mahjong::DoublingFactorReport::operator=(&r,&local_140);
  mahjong::DoublingFactorReport::~DoublingFactorReport(&local_140);
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0x12;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count(this_01,(key_type *)&local_140);
  if (sVar1 == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_140.wining_hand.pairs.
                           super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0x12);
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_140);
    local_158.buffer_._0_4_ = 0x12;
    sVar3 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_158);
    if (sVar1 != sVar3) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1e5);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar4 = SimpleString::asCharString((SimpleString *)&local_140);
    local_144 = DoubleEastWind;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count(this_01,&local_144);
    StringFrom((unsigned_long)&local_158);
    pcVar5 = SimpleString::asCharString(&local_158);
    local_150.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e5,&local_150);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_150);
    SimpleString::~SimpleString(&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  if (r.doubling_factor == 2) {
    pUVar2 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar4 = SimpleString::asCharString((SimpleString *)&local_140);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_158);
    local_150.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1e6,&local_150);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_150);
    SimpleString::~SimpleString(&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  mahjong::WiningState::setRoundWind(this_00,SouthWind);
  mahjong::DoubligFactorCounter::report(&local_140,this_02);
  mahjong::DoublingFactorReport::operator=(&r,&local_140);
  mahjong::DoublingFactorReport::~DoublingFactorReport(&local_140);
  local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
  _M_impl.super__Vector_impl_data._M_start._0_4_ = 0xe;
  sVar1 = std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>
          ::count(this_01,(key_type *)&local_140);
  if (sVar1 == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1eb,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start =
         (pointer)CONCAT44(local_140.wining_hand.pairs.
                           super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>._M_impl
                           .super__Vector_impl_data._M_start._4_4_,0xe);
    sVar1 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_140);
    local_158.buffer_._0_4_ = 0xe;
    sVar3 = std::
            set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
            count(this_01,(key_type *)&local_158);
    if (sVar1 != sVar3) {
      pUVar2 = UtestShell::getCurrent();
      (*pUVar2->_vptr_UtestShell[0x1b])
                (pUVar2,
                 "WARNING:\n\tThe \"Actual Parameter\" parameter is evaluated multiple times resulting in different values.\n\tThus the value in the error message is probably incorrect."
                 ,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
                 ,0x1eb);
    }
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar4 = SimpleString::asCharString((SimpleString *)&local_140);
    local_144 = EastWind;
    std::set<mahjong::Pattern,_std::less<mahjong::Pattern>,_std::allocator<mahjong::Pattern>_>::
    count(this_01,&local_144);
    StringFrom((unsigned_long)&local_158);
    pcVar5 = SimpleString::asCharString(&local_158);
    local_150.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1eb,&local_150);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_150);
    SimpleString::~SimpleString(&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  if (r.doubling_factor == 1) {
    pUVar2 = UtestShell::getCurrent();
    local_140.wining_hand.pairs.super__Vector_base<mahjong::Pair,_std::allocator<mahjong::Pair>_>.
    _M_impl.super__Vector_impl_data._M_start = (pointer)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0xe])
              (pUVar2,0,0,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_140);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions
              ((TestTerminatorWithoutExceptions *)&local_140);
  }
  else {
    pUVar2 = UtestShell::getCurrent();
    StringFrom((int)&local_140);
    pcVar4 = SimpleString::asCharString((SimpleString *)&local_140);
    StringFrom(value);
    pcVar5 = SimpleString::asCharString(&local_158);
    local_150.super_TestTerminator._vptr_TestTerminator =
         (TestTerminator)&PTR_exitCurrentTest_001e18b8;
    (*pUVar2->_vptr_UtestShell[0x16])
              (pUVar2,1,pcVar4,pcVar5,0,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/sidsryu[P]riichi-mahjong-scorer/test/doublingfactorcounter_test.cpp"
               ,0x1ec,&local_150);
    TestTerminatorWithoutExceptions::~TestTerminatorWithoutExceptions(&local_150);
    SimpleString::~SimpleString(&local_158);
    SimpleString::~SimpleString((SimpleString *)&local_140);
  }
  mahjong::DoublingFactorReport::~DoublingFactorReport(&r);
  return;
}

Assistant:

TEST(DoublingFactorCounterTest, HonorTiles_Wind)
{
	s.setRoundWind(Tile::EastWind);
	s.setSeatWind(Tile::SouthWind);

	addPair(Tile::WhiteDragon);
	addSequence(Tile::OneOfCharacters, true);
	addSequence(Tile::TwoOfCircles, false);
	addSequence(Tile::TwoOfBamboos, false);
	addTriplet(Tile::EastWind, false);

	s.selfDrawn();
	auto r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);

	s.setSeatWind(Tile::EastWind);	
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::DoubleEastWind));
	CHECK_EQUAL(2, r.doubling_factor);

	s.setRoundWind(Tile::SouthWind);
	r = c.report();

	CHECK_EQUAL(1, r.patterns.count(Pattern::EastWind));
	CHECK_EQUAL(1, r.doubling_factor);
}